

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynAccessor * ParseAccessorDefinition(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  SynBase *pSVar5;
  undefined4 extraout_var;
  SynBlock *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SynBlock *this_01;
  undefined4 extraout_var_02;
  SynAccessor *this_02;
  Lexeme *pLVar6;
  char *msg;
  char *str;
  SynIdentifier *local_48;
  SynIdentifier *this;
  undefined4 extraout_var_03;
  
  begin = ctx->currentLexeme;
  pSVar5 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar5 != (SynBase *)0x0) {
    bVar3 = anon_unknown.dwarf_15703::CheckAt
                      (ctx,lex_string,"ERROR: class member name expected after type");
    if (bVar3) {
      pLVar6 = ctx->currentLexeme;
      pcVar2 = pLVar6->pos;
      uVar1 = pLVar6->length;
      if (pLVar6->type != lex_none) {
        ctx->currentLexeme = pLVar6 + 1;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_00117c8c:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      pLVar6 = ctx->currentLexeme + -1;
      str = (char *)0x4;
      SynBase::SynBase((SynBase *)this,4,pLVar6,pLVar6);
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
      (this->name).begin = pcVar2;
      (this->name).end = pcVar2 + uVar1;
      if (ctx->currentLexeme->type == lex_ofigure) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        anon_unknown.dwarf_15703::CheckConsume(ctx,str,msg);
        this_00 = ParseBlock(ctx);
        if (this_00 == (SynBlock *)0x0) {
          anon_unknown.dwarf_15703::Report
                    (ctx,ctx->currentLexeme,"ERROR: function body expected after \'get\'");
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
          this_00 = (SynBlock *)CONCAT44(extraout_var_00,iVar4);
          SynBase::SynBase((SynBase *)this_00,0,ctx->currentLexeme,ctx->currentLexeme);
          (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
        }
        bVar3 = ParseContext::Consume(ctx,"set");
        if (bVar3) {
          if (ctx->currentLexeme->type == lex_oparen) {
            ctx->currentLexeme = ctx->currentLexeme + 1;
            local_48 = (SynIdentifier *)0x0;
            bVar3 = anon_unknown.dwarf_15703::CheckAt
                              (ctx,lex_string,"ERROR: r-value name not found after \'(\'");
            if (bVar3) {
              pLVar6 = ctx->currentLexeme;
              pcVar2 = pLVar6->pos;
              uVar1 = pLVar6->length;
              if (pLVar6->type != lex_none) {
                ctx->currentLexeme = pLVar6 + 1;
              }
              iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
              local_48 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar4);
              if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00117c8c;
              pLVar6 = ctx->currentLexeme + -1;
              SynBase::SynBase((SynBase *)local_48,4,pLVar6,pLVar6);
              (local_48->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
              (local_48->name).begin = pcVar2;
              (local_48->name).end = pcVar2 + uVar1;
            }
            anon_unknown.dwarf_15703::CheckConsume
                      (ctx,lex_cparen,"ERROR: \')\' not found after r-value");
          }
          else {
            local_48 = (SynIdentifier *)0x0;
          }
          this_01 = ParseBlock(ctx);
          if (this_01 == (SynBlock *)0x0) {
            anon_unknown.dwarf_15703::Report
                      (ctx,ctx->currentLexeme,"ERROR: function body expected after \'set\'");
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
            this_01 = (SynBlock *)CONCAT44(extraout_var_02,iVar4);
            SynBase::SynBase((SynBase *)this_01,0,ctx->currentLexeme,ctx->currentLexeme);
            (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
          }
        }
        else {
          local_48 = (SynIdentifier *)0x0;
          this_01 = (SynBlock *)0x0;
        }
        anon_unknown.dwarf_15703::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' is expected after property");
        anon_unknown.dwarf_15703::CheckConsume
                  (ctx,lex_semicolon,"ERROR: \';\' not found after class member list");
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this_02 = (SynAccessor *)CONCAT44(extraout_var_03,iVar4);
        if (ctx->firstLexeme < ctx->currentLexeme) {
          SynBase::SynBase((SynBase *)this_02,0x35,begin,ctx->currentLexeme + -1);
          (this_02->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247d48;
          this_02->type = pSVar5;
          this_02->name = this;
          this_02->getBlock = &this_00->super_SynBase;
          this_02->setBlock = &this_01->super_SynBase;
          this_02->setName = local_48;
          return this_02;
        }
        goto LAB_00117c8c;
      }
    }
    ctx->currentLexeme = begin;
  }
  return (SynAccessor *)0x0;
}

Assistant:

SynAccessor* ParseAccessorDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(SynBase *type = ParseType(ctx))
	{
		if(!CheckAt(ctx, lex_string, "ERROR: class member name expected after type"))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(!ctx.Consume(lex_ofigure))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, "get", "ERROR: 'get' is expected after '{'");

		SynBase *getBlock = ParseBlock(ctx);

		if(!getBlock)
		{
			Report(ctx, ctx.Current(), "ERROR: function body expected after 'get'");

			getBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		SynBase *setBlock = NULL;
		SynIdentifier *setNameIdentifier = NULL;

		if(ctx.Consume("set"))
		{
			if(ctx.Consume(lex_oparen))
			{
				if(CheckAt(ctx, lex_string, "ERROR: r-value name not found after '('"))
				{
					InplaceStr setName = ctx.Consume();
					setNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), setName);
				}

				CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after r-value");
			}

			setBlock = ParseBlock(ctx);

			if(!setBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: function body expected after 'set'");

				setBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' is expected after property");

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after class member list");

		return new (ctx.get<SynAccessor>()) SynAccessor(start, ctx.Previous(), type, nameIdentifier, getBlock, setBlock, setNameIdentifier);
	}

	return NULL;
}